

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_272f4d1::
SubpelVarianceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_const_unsigned_char_*)>
::RefTest(SubpelVarianceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_const_unsigned_char_*)>
          *this)

{
  ACMRandom *this_00;
  int iVar1;
  aom_bit_depth_t aVar2;
  uint8_t *puVar3;
  undefined8 *puVar4;
  uint32_t uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  byte bVar9;
  sbyte sVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  pointer *__ptr;
  uint uVar17;
  int iVar18;
  sbyte sVar19;
  int iVar20;
  SEARCH_METHODS *pSVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  undefined2 in_FPUControlWord;
  uint16_t in_FPUTagWord;
  undefined8 in_FPUInstructionPointer;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_118;
  ulong local_110;
  int local_104;
  AssertHelper local_100;
  int local_f4;
  uint32_t var2;
  uint32_t var1;
  uint32_t sse2;
  uint32_t sse1;
  RegisterStateCheckMMX reg_check_mmx;
  uint16_t *sec16;
  uint16_t *src16;
  byte bVar10;
  
  this_00 = &this->rnd_;
  iVar18 = 0;
  do {
    local_104 = iVar18 * 2;
    local_110 = 0;
    do {
      iVar6 = (this->params_).block_size;
      if ((this->params_).use_high_bit_depth == false) {
        if (0 < iVar6) {
          lVar16 = 0;
          do {
            uVar5 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
            this->src_[lVar16] = (uint8_t)(uVar5 >> 0x17);
            uVar5 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
            this->sec_[lVar16] = (uint8_t)(uVar5 >> 0x17);
            lVar16 = lVar16 + 1;
            iVar6 = (this->params_).block_size;
          } while (lVar16 < iVar6);
        }
        if (-1 < iVar6 + (this->params_).width + (this->params_).height) {
          lVar16 = -1;
          do {
            uVar5 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
            this->ref_[lVar16 + 1] = (uint8_t)(uVar5 >> 0x17);
            lVar16 = lVar16 + 1;
          } while (lVar16 < (long)(this->params_).height +
                            (long)(this->params_).width + (long)(this->params_).block_size);
        }
      }
      else {
        if (0 < iVar6) {
          lVar16 = 0;
          do {
            uVar5 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
            *(ushort *)(lVar16 * 2 + (long)this->src_ * 2) =
                 (ushort)(uVar5 >> 0xf) & (ushort)(this->params_).mask;
            uVar5 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
            *(ushort *)(lVar16 * 2 + (long)this->sec_ * 2) =
                 (ushort)(uVar5 >> 0xf) & (ushort)(this->params_).mask;
            lVar16 = lVar16 + 1;
            iVar6 = (this->params_).block_size;
          } while (lVar16 < iVar6);
        }
        if (-1 < iVar6 + (this->params_).width + (this->params_).height) {
          lVar16 = -1;
          do {
            uVar5 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
            *(ushort *)(lVar16 * 2 + 2 + (long)this->ref_ * 2) =
                 (ushort)(uVar5 >> 0xf) & (ushort)(this->params_).mask;
            lVar16 = lVar16 + 1;
          } while (lVar16 < (long)(this->params_).height +
                            (long)(this->params_).width + (long)(this->params_).block_size);
        }
      }
      reg_check_mmx.pre_fpu_env_[0]._0_1_ = (char)in_FPUControlWord;
      reg_check_mmx.pre_fpu_env_._12_4_ = SUB84(in_FPUInstructionPointer,0);
      reg_check_mmx.pre_fpu_env_[8] = (uint16_t)((ulong)in_FPUInstructionPointer >> 0x20);
      iVar6 = (this->params_).width;
      reg_check_mmx.pre_fpu_env_[4] = in_FPUTagWord;
      var1 = (*(this->params_).func)
                       (this->ref_,iVar6 + 1,iVar18,(int)local_110,this->src_,iVar6,&sse1,this->sec_
                       );
      libaom_test::RegisterStateCheckMMX::Check(&reg_check_mmx);
      iVar6 = (this->params_).log2width;
      iVar1 = (this->params_).log2height;
      bVar9 = (byte)iVar6;
      bVar10 = (byte)iVar1;
      if (iVar1 == 0x1f) {
        lVar15 = 0;
        uVar8 = 0;
      }
      else {
        puVar3 = this->ref_;
        iVar1 = (int)local_110 * 2;
        uVar17 = 1 << (bVar9 & 0x1f);
        uVar12 = uVar17;
        if ((int)uVar17 < 2) {
          uVar12 = 1;
        }
        lVar14 = (long)(int)(uVar17 + 1);
        lVar16 = (long)puVar3 * 2 + 2;
        lVar22 = 0;
        uVar8 = 0;
        lVar15 = 0;
        do {
          if (iVar6 != 0x1f) {
            lVar25 = (lVar22 + 1) * lVar14;
            lVar24 = (long)((int)lVar22 << (bVar9 & 0x1f));
            lVar13 = lVar14 * 2 * (lVar22 + 1) + lVar16;
            lVar23 = lVar22 * lVar14 * 2 + lVar16;
            uVar7 = 0;
            do {
              if ((this->params_).use_high_bit_depth == false) {
                iVar20 = ((int)(((uint)puVar3[uVar7 + lVar22 * lVar14 + 1] -
                                (uint)puVar3[uVar7 + lVar22 * lVar14]) * local_104 + 8) >> 4) +
                         (uint)puVar3[uVar7 + lVar22 * lVar14];
                iVar20 = ((int)((((uint)puVar3[uVar7 + lVar25] - iVar20) +
                                ((int)(((uint)puVar3[uVar7 + lVar25 + 1] -
                                       (uint)puVar3[uVar7 + lVar25]) * local_104 + 8) >> 4)) * iVar1
                               + 8) >> 4) + (uint)this->sec_[uVar7 + lVar24] + iVar20;
                uVar17 = (uint)this->src_[uVar7 + lVar24];
              }
              else {
                uVar17 = (uint)*(ushort *)(lVar23 + -2 + uVar7 * 2);
                iVar20 = ((int)((*(ushort *)(lVar23 + uVar7 * 2) - uVar17) * local_104 + 8) >> 4) +
                         uVar17;
                uVar17 = (uint)*(ushort *)(lVar13 + -2 + uVar7 * 2);
                iVar20 = ((int)(((uVar17 - iVar20) +
                                ((int)((*(ushort *)(lVar13 + uVar7 * 2) - uVar17) * local_104 + 8)
                                >> 4)) * iVar1 + 8) >> 4) +
                         (uint)*(ushort *)((long)this->sec_ * 2 + lVar24 * 2 + uVar7 * 2) + iVar20;
                uVar17 = (uint)*(ushort *)((long)this->src_ * 2 + lVar24 * 2 + uVar7 * 2);
              }
              iVar20 = (iVar20 + 1 >> 1) - uVar17;
              uVar8 = uVar8 + (uint)(iVar20 * iVar20);
              lVar15 = lVar15 + iVar20;
              uVar7 = uVar7 + 1;
            } while (uVar12 != uVar7);
          }
          lVar22 = lVar22 + 1;
          local_f4 = iVar6;
        } while (lVar22 != 1L << (bVar10 & 0x3f));
      }
      aVar2 = (this->params_).bit_depth;
      if (aVar2 == AOM_BITS_12) {
        sVar19 = 4;
        sVar11 = 8;
        lVar16 = 0x80;
        lVar14 = 8;
LAB_007be4a4:
        uVar8 = lVar16 + uVar8 >> sVar11;
        lVar15 = lVar14 + lVar15 >> sVar19;
      }
      else if (aVar2 == AOM_BITS_10) {
        lVar14 = 2;
        sVar11 = 4;
        lVar16 = 8;
        sVar19 = 2;
        goto LAB_007be4a4;
      }
      sse2 = (uint32_t)uVar8;
      var2 = sse2 - (int)((ulong)(lVar15 * lVar15) >> (bVar10 + bVar9 & 0x3f));
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&reg_check_mmx,"sse1","sse2",&sse1,&sse2);
      if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
        testing::Message::Message((Message *)&local_118);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_118._M_head_impl + 0x10),"at position ",0xc);
        std::ostream::operator<<(local_118._M_head_impl + 0x10,iVar18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_118._M_head_impl + 0x10),", ",2);
        std::ostream::operator<<(local_118._M_head_impl + 0x10,(int)local_110);
        puVar4 = (undefined8 *)
                 CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                          CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
        pSVar21 = "";
        if (puVar4 != (undefined8 *)0x0) {
          pSVar21 = (SEARCH_METHODS *)*puVar4;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_100,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
                   ,0x594,(char *)pSVar21);
        testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_118);
        testing::internal::AssertHelper::~AssertHelper(&local_100);
        if (local_118._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_118._M_head_impl + 8))();
        }
      }
      puVar4 = (undefined8 *)
               CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                        CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
      if (puVar4 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar4 != puVar4 + 2) {
          operator_delete((undefined8 *)*puVar4);
        }
        operator_delete(puVar4);
      }
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&reg_check_mmx,"var1","var2",&var1,&var2);
      if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
        testing::Message::Message((Message *)&local_118);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_118._M_head_impl + 0x10),"at position ",0xc);
        std::ostream::operator<<(local_118._M_head_impl + 0x10,iVar18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_118._M_head_impl + 0x10),", ",2);
        std::ostream::operator<<(local_118._M_head_impl + 0x10,(int)local_110);
        puVar4 = (undefined8 *)
                 CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                          CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
        pSVar21 = "";
        if (puVar4 != (undefined8 *)0x0) {
          pSVar21 = (SEARCH_METHODS *)*puVar4;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_100,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
                   ,0x595,(char *)pSVar21);
        testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_118);
        testing::internal::AssertHelper::~AssertHelper(&local_100);
        if (local_118._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_118._M_head_impl + 8))();
        }
      }
      puVar4 = (undefined8 *)
               CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                        CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
      if (puVar4 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar4 != puVar4 + 2) {
          operator_delete((undefined8 *)*puVar4);
        }
        operator_delete(puVar4);
      }
      uVar12 = (int)local_110 + 1;
      local_110 = (ulong)uVar12;
    } while (uVar12 != 8);
    iVar18 = iVar18 + 1;
    if (iVar18 == 8) {
      return;
    }
  } while( true );
}

Assistant:

void SubpelVarianceTest<SubpixAvgVarMxNFunc>::RefTest() {
  for (int x = 0; x < 8; ++x) {
    for (int y = 0; y < 8; ++y) {
      if (!use_high_bit_depth()) {
        for (int j = 0; j < block_size(); j++) {
          src_[j] = rnd_.Rand8();
          sec_[j] = rnd_.Rand8();
        }
        for (int j = 0; j < block_size() + width() + height() + 1; j++) {
          ref_[j] = rnd_.Rand8();
        }
      } else {
        for (int j = 0; j < block_size(); j++) {
          CONVERT_TO_SHORTPTR(src_)[j] = rnd_.Rand16() & mask();
          CONVERT_TO_SHORTPTR(sec_)[j] = rnd_.Rand16() & mask();
        }
        for (int j = 0; j < block_size() + width() + height() + 1; j++) {
          CONVERT_TO_SHORTPTR(ref_)[j] = rnd_.Rand16() & mask();
        }
      }
      uint32_t sse1, sse2;
      uint32_t var1, var2;
      API_REGISTER_STATE_CHECK(var1 = params_.func(ref_, width() + 1, x, y,
                                                   src_, width(), &sse1, sec_));
      var2 = subpel_avg_variance_ref(ref_, src_, sec_, params_.log2width,
                                     params_.log2height, x, y, &sse2,
                                     use_high_bit_depth(), params_.bit_depth);
      EXPECT_EQ(sse1, sse2) << "at position " << x << ", " << y;
      EXPECT_EQ(var1, var2) << "at position " << x << ", " << y;
    }
  }
}